

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLatticePentRod.cpp
# Opt level: O0

void __thiscall
OpenMD::shapedLatticePentRod::shapedLatticePentRod
          (shapedLatticePentRod *this,RealType latticeConstant,string *latticeType,RealType radius,
          RealType length)

{
  double *pdVar1;
  shapedLattice *this_00;
  Vector3<double> *origin_00;
  string *in_RSI;
  undefined8 *in_RDI;
  double dVar2;
  undefined8 in_XMM1_Qa;
  double in_XMM2_Qa;
  Vector3d origin;
  Vector3d dimension;
  Vector3d *in_stack_fffffffffffffee8;
  shapedLattice *in_stack_fffffffffffffef0;
  string *in_stack_ffffffffffffff50;
  RealType in_stack_ffffffffffffff58;
  shapedLattice *in_stack_ffffffffffffff60;
  Vector<double,_3U> local_70;
  string local_48 [32];
  double local_28;
  undefined8 local_20;
  
  local_28 = in_XMM2_Qa;
  local_20 = in_XMM1_Qa;
  std::__cxx11::string::string(local_48,in_RSI);
  shapedLattice::shapedLattice
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_48);
  *in_RDI = &PTR__shapedLatticePentRod_005059f8;
  in_RDI[0x17] = local_20;
  in_RDI[0x18] = local_28;
  Vector3<double>::Vector3((Vector3<double> *)0x140372);
  dVar2 = local_28 + local_28;
  pdVar1 = Vector<double,_3U>::operator[](&local_70,0);
  *pdVar1 = dVar2;
  dVar2 = local_28 + local_28;
  pdVar1 = Vector<double,_3U>::operator[](&local_70,1);
  *pdVar1 = dVar2;
  pdVar1 = Vector<double,_3U>::operator[](&local_70,2);
  *pdVar1 = local_28 + local_28;
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  shapedLattice::setGridDimension(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Vector3<double>::Vector3((Vector3<double> *)0x140457);
  pdVar1 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xffffffffffffff60,0);
  *pdVar1 = 0.0;
  this_00 = (shapedLattice *)
            Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xffffffffffffff60,1);
  ((Vector<double,_3U> *)&this_00->_vptr_shapedLattice)->data_[0] = 0.0;
  origin_00 = (Vector3<double> *)
              Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xffffffffffffff60,2);
  (origin_00->super_Vector<double,_3U>).data_[0] = 2.04;
  Vector3<double>::Vector3((Vector3<double> *)this_00,origin_00);
  shapedLattice::setOrigin(this_00,origin_00);
  return;
}

Assistant:

shapedLatticePentRod::shapedLatticePentRod(RealType latticeConstant,
                                             std::string latticeType,
                                             RealType radius, RealType length) :
      shapedLattice(latticeConstant, latticeType) {
    rodRadius_ = radius;
    rodLength_ = length;
    Vector3d dimension;
    dimension[0] = 2.0 * length;
    dimension[1] = 2.0 * length;
    dimension[2] = 2.0 * length;
    setGridDimension(dimension);
    Vector3d origin;
    origin[0] = 0;
    origin[1] = 0;
    origin[2] = 2.04;
    setOrigin(origin);
  }